

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_tri_uv_bounding_box2
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_DBL *uv_min,REF_DBL *uv_max)

{
  REF_GEOM ref_geom_00;
  REF_CELL ref_cell_00;
  uint uVar1;
  REF_DBL local_118;
  REF_DBL local_110;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT local_e8;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  REF_INT sense;
  REF_INT cells [2];
  REF_INT ncell;
  REF_INT i;
  REF_DBL uv [2];
  int local_4c;
  int local_48;
  REF_INT iuv;
  REF_INT cell_node;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_DBL *uv_max_local;
  REF_DBL *uv_min_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  ref_cell_00 = ref_grid->cell[3];
  ref_grid_local._4_4_ = ref_cell_list_with2(ref_cell_00,node0,node1,2,cells,nodes + 0x1a);
  if (ref_grid_local._4_4_ == 0) {
    if ((long)cells[0] == 2) {
      for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
        uv_min[local_4c] = 1e+200;
      }
      for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
        uv_max[local_4c] = -1e+200;
      }
      for (cells[1] = 0; cells[1] < cells[0]; cells[1] = cells[1] + 1) {
        uVar1 = ref_cell_nodes(ref_cell_00,nodes[(long)cells[1] + 0x1a],&local_e8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x5ed,"ref_geom_tri_uv_bounding_box2",(ulong)uVar1,"cell nodes");
          return uVar1;
        }
        for (local_48 = 0; local_48 < ref_cell_00->node_per; local_48 = local_48 + 1) {
          uVar1 = ref_geom_cell_tuv(ref_geom_00,(&local_e8)[local_48],&local_e8,2,(REF_DBL *)&ncell,
                                    nodes + 0x19);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x5f1,"ref_geom_tri_uv_bounding_box2",(ulong)uVar1,"cell uv");
            return uVar1;
          }
          for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
            if (*(double *)(&ncell + (long)local_4c * 2) <= uv_min[local_4c]) {
              local_110 = *(REF_DBL *)(&ncell + (long)local_4c * 2);
            }
            else {
              local_110 = uv_min[local_4c];
            }
            uv_min[local_4c] = local_110;
          }
          for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
            if (uv_max[local_4c] < *(double *)(&ncell + (long)local_4c * 2) ||
                uv_max[local_4c] == *(double *)(&ncell + (long)local_4c * 2)) {
              local_118 = *(REF_DBL *)(&ncell + (long)local_4c * 2);
            }
            else {
              local_118 = uv_max[local_4c];
            }
            uv_max[local_4c] = local_118;
          }
        }
      }
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5e7,
             "ref_geom_tri_uv_bounding_box2","expected two tri for box2 nodes",2,(long)cells[0]);
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5e6,
           "ref_geom_tri_uv_bounding_box2",(ulong)ref_grid_local._4_4_,"list");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_uv_bounding_box2(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_DBL *uv_min,
                                                 REF_DBL *uv_max) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, cell_node, iuv;
  REF_DBL uv[2];
  REF_INT i, ncell, cells[2];
  REF_INT sense;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cells), "list");
  REIS(2, ncell, "expected two tri for box2 nodes");

  for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = REF_DBL_MAX;
  for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = REF_DBL_MIN;
  for (i = 0; i < ncell; i++) {
    cell = cells[i];
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_geom_cell_tuv(ref_geom, nodes[cell_node], nodes, REF_GEOM_FACE,
                            uv, &sense),
          "cell uv");
      for (iuv = 0; iuv < 2; iuv++) uv_min[iuv] = MIN(uv_min[iuv], uv[iuv]);
      for (iuv = 0; iuv < 2; iuv++) uv_max[iuv] = MAX(uv_max[iuv], uv[iuv]);
    }
  }

  return REF_SUCCESS;
}